

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurl.cpp
# Opt level: O3

bool __thiscall QUrl::isValid(QUrl *this)

{
  byte bVar1;
  QUrlPrivate *pQVar2;
  Error *pEVar3;
  long lVar4;
  char16_t *pcVar5;
  ErrorCode EVar6;
  qsizetype i;
  long lVar7;
  
  pQVar2 = this->d;
  if ((pQVar2 == (QUrlPrivate *)0x0) ||
     (((bVar1 = pQVar2->sectionIsPresent, bVar1 == 0 && (pQVar2->port == -1)) &&
      ((pQVar2->path).d.size == 0)))) {
    return false;
  }
  pEVar3 = (pQVar2->error)._M_t.
           super___uniq_ptr_impl<QUrlPrivate::Error,_std::default_delete<QUrlPrivate::Error>_>._M_t.
           super__Tuple_impl<0UL,_QUrlPrivate::Error_*,_std::default_delete<QUrlPrivate::Error>_>.
           super__Head_base<0UL,_QUrlPrivate::Error_*,_false>._M_head_impl;
  if (pEVar3 == (Error *)0x0) {
    lVar4 = (pQVar2->path).d.size;
    EVar6 = NoError;
    if (lVar4 != 0) {
      pcVar5 = (pQVar2->path).d.ptr;
      if (*pcVar5 == L'/') {
        if (((lVar4 != 1) && ((bVar1 & 0x1e) == 0)) &&
           (EVar6 = AuthorityAbsentAndPathIsDoubleSlash, pcVar5[1] != L'/')) {
          EVar6 = NoError;
        }
      }
      else if ((bVar1 & 8) == 0) {
        if ((bVar1 & 1) == 0) {
          EVar6 = NoError;
          lVar7 = 0;
          do {
            if (pcVar5[lVar7] == L'/') break;
            if (pcVar5[lVar7] == L':') goto LAB_0025b1ac;
            lVar7 = lVar7 + 1;
          } while (lVar4 != lVar7);
        }
      }
      else {
LAB_0025b1ac:
        EVar6 = RelativeUrlPathContainsColonBeforeSlash;
      }
    }
  }
  else {
    EVar6 = pEVar3->code;
  }
  return EVar6 == NoError;
}

Assistant:

bool QUrl::isEmpty() const
{
    if (!d) return true;
    return d->isEmpty();
}